

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateTimeEdit::paintEvent(QDateTimeEdit *this,QPaintEvent *event)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  undefined1 *local_138;
  QWidget *pQStack_130;
  QStyle *local_128;
  QStyleOptionComboBox local_118;
  QStyleOptionSpinBox opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  if ((*(char *)(lVar2 + 0x4fa) == '\x01') && ((*(uint *)(lVar2 + 0x470) & 0x3f00) != 0)) {
    opt._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOptionComplex._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOptionComplex.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOptionComplex.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOptionComplex.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOptionComplex.super_QStyleOption.palette.d =
         (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOptionComplex.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOptionComplex.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOptionComplex.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOptionComplex.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionSpinBox::QStyleOptionSpinBox(&opt);
    (**(code **)(*(long *)&(this->super_QAbstractSpinBox).super_QWidget + 0x1c0))(this,&opt);
    memset(&local_118,0xaa,0x90);
    QStyleOptionComboBox::QStyleOptionComboBox(&local_118);
    QStyleOption::initFrom((QStyleOption *)&local_118,(QWidget *)this);
    local_118.editable = true;
    local_118.frame = opt.frame;
    local_118.super_QStyleOptionComplex.subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>
    .super_QFlagsStorage<QStyle::SubControl>.i =
         opt.super_QStyleOptionComplex.subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
         super_QFlagsStorage<QStyle::SubControl>.i;
    local_118.super_QStyleOptionComplex.activeSubControls.
    super_QFlagsStorageHelper<QStyle::SubControl,_4>.super_QFlagsStorage<QStyle::SubControl>.i =
         opt.super_QStyleOptionComplex.activeSubControls.
         super_QFlagsStorageHelper<QStyle::SubControl,_4>.super_QFlagsStorage<QStyle::SubControl>.i;
    local_118.super_QStyleOptionComplex.super_QStyleOption.state.
    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i =
         opt.super_QStyleOptionComplex.super_QStyleOption.state.
         super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i;
    if ((*(byte *)(lVar2 + 0x3d0) & 2) != 0) {
      local_118.super_QStyleOptionComplex.super_QStyleOption.state.
      super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)
           ((uint)opt.super_QStyleOptionComplex.super_QStyleOption.state.
                  super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                  super_QFlagsStorage<QStyle::StateFlag>.i & 0xfffffffe);
    }
    local_128 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
    local_138 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_130 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
    QStylePainter::QStylePainter((QStylePainter *)&local_138,(QWidget *)this);
    QStylePainter::drawComplexControl
              ((QStylePainter *)&local_138,CC_ComboBox,&local_118.super_QStyleOptionComplex);
    QPainter::~QPainter((QPainter *)&local_138);
    QStyleOptionComboBox::~QStyleOptionComboBox(&local_118);
    QStyleOption::~QStyleOption((QStyleOption *)&opt);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QAbstractSpinBox::paintEvent((QAbstractSpinBox *)this,event);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::paintEvent(QPaintEvent *event)
{
    Q_D(QDateTimeEdit);
    if (!d->calendarPopupEnabled()) {
        QAbstractSpinBox::paintEvent(event);
        return;
    }

    QStyleOptionSpinBox opt;
    initStyleOption(&opt);

    QStyleOptionComboBox optCombo;

    optCombo.initFrom(this);
    optCombo.editable = true;
    optCombo.frame = opt.frame;
    optCombo.subControls = opt.subControls;
    optCombo.activeSubControls = opt.activeSubControls;
    optCombo.state = opt.state;
    if (d->readOnly) {
        optCombo.state &= ~QStyle::State_Enabled;
    }

    QStylePainter p(this);
    p.drawComplexControl(QStyle::CC_ComboBox, optCombo);
}